

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O2

void deqp::gls::ub::anon_unknown_12::generateCompareSrc
               (ostringstream *src,char *resultVar,VarType *type,char *srcName,char *apiName,
               UniformLayout *layout,void *basePtr,deUint32 unusedMask)

{
  bool bVar1;
  UniformLayout *pUVar2;
  _Alloc_hider _Var3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  ostream *poVar7;
  bool *__rhs;
  undefined8 *puVar8;
  UniformLayoutEntry *entry;
  int elemNdx;
  string op;
  undefined4 in_stack_fffffffffffffedc;
  deUint32 in_stack_fffffffffffffee0;
  allocator<char> local_111;
  ostringstream *local_110;
  int local_108;
  allocator<char> local_101;
  char *local_100;
  UniformLayout *local_f8;
  VarType *local_f0;
  UniformLayout *local_e8;
  char *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  int *local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_110 = src;
  local_100 = resultVar;
  local_f8 = layout;
  local_f0 = type;
  local_e8 = (UniformLayout *)apiName;
  local_e0 = srcName;
  if (*(int *)resultVar == 0) {
    bVar1 = false;
    local_b8 = (int *)resultVar;
  }
  else {
    if (*(int *)resultVar != 1) {
      lVar5 = *(long *)(resultVar + 8);
      for (puVar8 = *(undefined8 **)(lVar5 + 0x20); puVar8 != *(undefined8 **)(lVar5 + 0x28);
          puVar8 = puVar8 + 8) {
        if ((*(uint *)(puVar8 + 7) & (uint)basePtr) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,".",(allocator<char> *)&local_70);
          std::operator+(&local_90,&local_d8,(char *)*puVar8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,(char *)local_f0,(allocator<char> *)&local_108);
          std::operator+(&local_d8,&local_70,&local_90);
          _Var3._M_p = local_d8._M_dataplus._M_p;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,local_e0,&local_111);
          std::operator+(&local_b0,&local_50,&local_90);
          generateCompareSrc(local_110,(char *)(puVar8 + 4),(VarType *)_Var3._M_p,
                             local_b0._M_dataplus._M_p,(char *)local_e8,local_f8,
                             (void *)CONCAT44(in_stack_fffffffffffffedc,(uint)basePtr),
                             in_stack_fffffffffffffee0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          lVar5 = *(long *)(local_100 + 8);
        }
      }
      return;
    }
    local_b8 = *(int **)(resultVar + 8);
    if (*local_b8 != 0) {
      for (local_108 = 0; local_108 < *(int *)(local_100 + 0x10); local_108 = local_108 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"[",(allocator<char> *)&local_50);
        de::toString<int>(&local_b0,&local_108);
        std::operator+(&local_d8,&local_70,&local_b0);
        std::operator+(&local_90,&local_d8,"]");
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,(char *)local_f0,&local_111);
        std::operator+(&local_d8,&local_70,&local_90);
        _Var3._M_p = local_d8._M_dataplus._M_p;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,local_e0,&local_101);
        std::operator+(&local_b0,&local_50,&local_90);
        generateCompareSrc(local_110,(char *)local_b8,(VarType *)_Var3._M_p,
                           local_b0._M_dataplus._M_p,(char *)local_e8,local_f8,
                           (void *)CONCAT44(in_stack_fffffffffffffedc,(uint)basePtr),
                           in_stack_fffffffffffffee0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
      }
      return;
    }
    bVar1 = true;
  }
  pcVar6 = glu::getDataTypeName(local_b8[2]);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,local_e0,(allocator<char> *)&local_70);
  __rhs = glcts::fixed_sample_locations_values + 1;
  if (bVar1) {
    __rhs = (bool *)0x167134c;
  }
  std::operator+(&local_90,&local_d8,__rhs);
  std::__cxx11::string::~string((string *)&local_d8);
  pUVar2 = local_e8;
  iVar4 = UniformLayout::getUniformIndex(local_e8,local_90._M_dataplus._M_p);
  entry = (pUVar2->uniforms).
          super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
          ._M_impl.super__Vector_impl_data._M_start + iVar4;
  if (bVar1) {
    for (iVar4 = 0; iVar4 < *(int *)(local_100 + 0x10); iVar4 = iVar4 + 1) {
      poVar7 = std::operator<<(&local_110->super_basic_ostream<char,_std::char_traits<char>_>,
                               "\tresult *= compare_");
      poVar7 = std::operator<<(poVar7,pcVar6);
      poVar7 = std::operator<<(poVar7,"(");
      poVar7 = std::operator<<(poVar7,(char *)local_f0);
      poVar7 = std::operator<<(poVar7,"[");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
      std::operator<<(poVar7,"], ");
      generateValueSrc(local_110,entry,local_f8,iVar4);
      std::operator<<(&local_110->super_basic_ostream<char,_std::char_traits<char>_>,");\n");
    }
  }
  else {
    poVar7 = std::operator<<(&local_110->super_basic_ostream<char,_std::char_traits<char>_>,
                             "\tresult *= compare_");
    poVar7 = std::operator<<(poVar7,pcVar6);
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = std::operator<<(poVar7,(char *)local_f0);
    std::operator<<(poVar7,", ");
    generateValueSrc(local_110,entry,local_f8,0);
    std::operator<<(&local_110->super_basic_ostream<char,_std::char_traits<char>_>,");\n");
  }
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void generateCompareSrc (std::ostringstream& src, const char* resultVar, const VarType& type, const char* srcName, const char* apiName, const UniformLayout& layout, const void* basePtr, deUint32 unusedMask)
{
	if (type.isBasicType() || (type.isArrayType() && type.getElementType().isBasicType()))
	{
		// Basic type or array of basic types.
		bool						isArray			= type.isArrayType();
		glu::DataType				elementType		= isArray ? type.getElementType().getBasicType() : type.getBasicType();
		const char*					typeName		= glu::getDataTypeName(elementType);
		std::string					fullApiName		= string(apiName) + (isArray ? "[0]" : ""); // Arrays are always postfixed with [0]
		int							uniformNdx		= layout.getUniformIndex(fullApiName.c_str());
		const UniformLayoutEntry&	entry			= layout.uniforms[uniformNdx];

		if (isArray)
		{
			for (int elemNdx = 0; elemNdx < type.getArraySize(); elemNdx++)
			{
				src << "\tresult *= compare_" << typeName << "(" << srcName << "[" << elemNdx << "], ";
				generateValueSrc(src, entry, basePtr, elemNdx);
				src << ");\n";
			}
		}
		else
		{
			src << "\tresult *= compare_" << typeName << "(" << srcName << ", ";
			generateValueSrc(src, entry, basePtr, 0);
			src << ");\n";
		}
	}
	else if (type.isArrayType())
	{
		const VarType& elementType = type.getElementType();

		for (int elementNdx = 0; elementNdx < type.getArraySize(); elementNdx++)
		{
			std::string op = string("[") + de::toString(elementNdx) + "]";
			generateCompareSrc(src, resultVar, elementType, (string(srcName) + op).c_str(), (string(apiName) + op).c_str(), layout, basePtr, unusedMask);
		}
	}
	else
	{
		DE_ASSERT(type.isStructType());

		for (StructType::ConstIterator memberIter = type.getStruct().begin(); memberIter != type.getStruct().end(); memberIter++)
		{
			if (memberIter->getFlags() & unusedMask)
				continue; // Skip member.

			string op = string(".") + memberIter->getName();
			generateCompareSrc(src, resultVar, memberIter->getType(), (string(srcName) + op).c_str(), (string(apiName) + op).c_str(), layout, basePtr, unusedMask);
		}
	}
}